

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_avx.hpp
# Opt level: O1

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_>::weight_from_cos
          (batch *__return_storage_ptr__,PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_> *this,
          PolarExtentCoreContext *ctx,batch cos_angle)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  batch *in_RAX;
  undefined1 auVar10 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  
  uVar1 = *(undefined4 *)&this[0xf].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar11._4_4_ = uVar1;
  auVar11._0_4_ = uVar1;
  auVar11._8_4_ = uVar1;
  auVar11._12_4_ = uVar1;
  auVar11._16_4_ = uVar1;
  auVar11._20_4_ = uVar1;
  auVar11._24_4_ = uVar1;
  auVar11._28_4_ = uVar1;
  auVar10 = in_ZMM0._0_32_;
  auVar4 = vcmpps_avx(auVar11,auVar10,2);
  auVar12 = vpcmpeqd_avx2(auVar11,auVar11);
  auVar11 = auVar12 & ~auVar4;
  if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar11 >> 0x7f,0) != '\0') ||
        (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar11 >> 0xbf,0) != '\0') ||
      (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar11[0x1f] < '\0') {
    uVar1 = *(undefined4 *)((long)&this[0xf].super_PolarExtentCore._vptr_PolarExtentCore + 4);
    auVar13._4_4_ = uVar1;
    auVar13._0_4_ = uVar1;
    auVar13._8_4_ = uVar1;
    auVar13._12_4_ = uVar1;
    auVar13._16_4_ = uVar1;
    auVar13._20_4_ = uVar1;
    auVar13._24_4_ = uVar1;
    auVar13._28_4_ = uVar1;
    auVar11 = vcmpps_avx(auVar10,auVar13,2);
    auVar12 = auVar12 & ~auVar11;
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0x7f,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0xbf,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0')
    {
      auVar15._8_4_ = 0x7fffffff;
      auVar15._0_8_ = 0x7fffffff7fffffff;
      auVar15._12_4_ = 0x7fffffff;
      auVar15._16_4_ = 0x7fffffff;
      auVar15._20_4_ = 0x7fffffff;
      auVar15._24_4_ = 0x7fffffff;
      auVar15._28_4_ = 0x7fffffff;
      auVar17._8_4_ = 0x3f000000;
      auVar17._0_8_ = 0x3f0000003f000000;
      auVar17._12_4_ = 0x3f000000;
      auVar17._16_4_ = 0x3f000000;
      auVar17._20_4_ = 0x3f000000;
      auVar17._24_4_ = 0x3f000000;
      auVar17._28_4_ = 0x3f000000;
      auVar11 = vandps_avx(auVar10,auVar15);
      auVar5 = vcmpps_avx(auVar17,auVar11,1);
      auVar14._8_4_ = 0xbf000000;
      auVar14._0_8_ = 0xbf000000bf000000;
      auVar14._12_4_ = 0xbf000000;
      auVar14._16_4_ = 0xbf000000;
      auVar14._20_4_ = 0xbf000000;
      auVar14._24_4_ = 0xbf000000;
      auVar14._28_4_ = 0xbf000000;
      auVar7 = vfmadd213ps_fma(auVar11,auVar14,auVar17);
      auVar11 = vsqrtps_avx(ZEXT1632(auVar7));
      fVar2 = *(float *)&this[0x11].super_PolarExtentCore._vptr_PolarExtentCore;
      auVar12 = vblendvps_avx(auVar10,auVar11,auVar5);
      auVar11 = vandps_avx(auVar12,auVar15);
      auVar21._8_4_ = 0x80000000;
      auVar21._0_8_ = 0x8000000080000000;
      auVar21._12_4_ = 0x80000000;
      auVar21._16_4_ = 0x80000000;
      auVar21._20_4_ = 0x80000000;
      auVar21._24_4_ = 0x80000000;
      auVar21._28_4_ = 0x80000000;
      auVar17 = vcmpps_avx(auVar17,auVar11,1);
      auVar16._8_4_ = 0x3f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      auVar16._12_4_ = 0x3f800000;
      auVar16._16_4_ = 0x3f800000;
      auVar16._20_4_ = 0x3f800000;
      auVar16._24_4_ = 0x3f800000;
      auVar16._28_4_ = 0x3f800000;
      auVar15 = vsubps_avx(auVar16,auVar11);
      auVar6._4_4_ = auVar15._4_4_ * 0.5;
      auVar6._0_4_ = auVar15._0_4_ * 0.5;
      auVar6._8_4_ = auVar15._8_4_ * 0.5;
      auVar6._12_4_ = auVar15._12_4_ * 0.5;
      auVar6._16_4_ = auVar15._16_4_ * 0.5;
      auVar6._20_4_ = auVar15._20_4_ * 0.5;
      auVar6._24_4_ = auVar15._24_4_ * 0.5;
      auVar6._28_4_ = 0x3f000000;
      auVar8._4_4_ = auVar12._4_4_ * auVar12._4_4_;
      auVar8._0_4_ = auVar12._0_4_ * auVar12._0_4_;
      auVar8._8_4_ = auVar12._8_4_ * auVar12._8_4_;
      auVar8._12_4_ = auVar12._12_4_ * auVar12._12_4_;
      auVar8._16_4_ = auVar12._16_4_ * auVar12._16_4_;
      auVar8._20_4_ = auVar12._20_4_ * auVar12._20_4_;
      auVar8._24_4_ = auVar12._24_4_ * auVar12._24_4_;
      auVar8._28_4_ = auVar15._28_4_;
      auVar15 = vblendvps_avx(auVar8,auVar6,auVar17);
      auVar6 = vsqrtps_avx(auVar15);
      auVar12 = vandps_avx(auVar12,auVar21);
      auVar11 = vblendvps_avx(auVar11,auVar6,auVar17);
      auVar22._8_4_ = 0x3cc617e3;
      auVar22._0_8_ = 0x3cc617e33cc617e3;
      auVar22._12_4_ = 0x3cc617e3;
      auVar22._16_4_ = 0x3cc617e3;
      auVar22._20_4_ = 0x3cc617e3;
      auVar22._24_4_ = 0x3cc617e3;
      auVar22._28_4_ = 0x3cc617e3;
      auVar25._8_4_ = 0x3d2cb352;
      auVar25._0_8_ = 0x3d2cb3523d2cb352;
      auVar25._12_4_ = 0x3d2cb352;
      auVar25._16_4_ = 0x3d2cb352;
      auVar25._20_4_ = 0x3d2cb352;
      auVar25._24_4_ = 0x3d2cb352;
      auVar25._28_4_ = 0x3d2cb352;
      auVar7 = vfmadd213ps_fma(auVar25,auVar15,auVar22);
      auVar23._8_4_ = 0x3d3a3ec7;
      auVar23._0_8_ = 0x3d3a3ec73d3a3ec7;
      auVar23._12_4_ = 0x3d3a3ec7;
      auVar23._16_4_ = 0x3d3a3ec7;
      auVar23._20_4_ = 0x3d3a3ec7;
      auVar23._24_4_ = 0x3d3a3ec7;
      auVar23._28_4_ = 0x3d3a3ec7;
      auVar7 = vfmadd231ps_fma(auVar23,auVar15,ZEXT1632(auVar7));
      auVar26._8_4_ = 0x3d9980f6;
      auVar26._0_8_ = 0x3d9980f63d9980f6;
      auVar26._12_4_ = 0x3d9980f6;
      auVar26._16_4_ = 0x3d9980f6;
      auVar26._20_4_ = 0x3d9980f6;
      auVar26._24_4_ = 0x3d9980f6;
      auVar26._28_4_ = 0x3d9980f6;
      auVar27._8_4_ = 0x3e2aaae4;
      auVar27._0_8_ = 0x3e2aaae43e2aaae4;
      auVar27._12_4_ = 0x3e2aaae4;
      auVar27._16_4_ = 0x3e2aaae4;
      auVar27._20_4_ = 0x3e2aaae4;
      auVar27._24_4_ = 0x3e2aaae4;
      auVar27._28_4_ = 0x3e2aaae4;
      auVar7 = vfmadd231ps_fma(auVar26,auVar15,ZEXT1632(auVar7));
      auVar7 = vfmadd231ps_fma(auVar27,auVar15,ZEXT1632(auVar7));
      auVar9._4_4_ = auVar11._4_4_ * auVar15._4_4_;
      auVar9._0_4_ = auVar11._0_4_ * auVar15._0_4_;
      auVar9._8_4_ = auVar11._8_4_ * auVar15._8_4_;
      auVar9._12_4_ = auVar11._12_4_ * auVar15._12_4_;
      auVar9._16_4_ = auVar11._16_4_ * auVar15._16_4_;
      auVar9._20_4_ = auVar11._20_4_ * auVar15._20_4_;
      auVar9._24_4_ = auVar11._24_4_ * auVar15._24_4_;
      auVar9._28_4_ = auVar15._28_4_;
      auVar7 = vfmadd213ps_fma(auVar9,ZEXT1632(auVar7),auVar11);
      auVar24._8_4_ = 0x3fc90fdb;
      auVar24._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar24._12_4_ = 0x3fc90fdb;
      auVar24._16_4_ = 0x3fc90fdb;
      auVar24._20_4_ = 0x3fc90fdb;
      auVar24._24_4_ = 0x3fc90fdb;
      auVar24._28_4_ = 0x3fc90fdb;
      auVar11 = vsubps_avx(auVar24,ZEXT1632(CONCAT412(auVar7._12_4_ + auVar7._12_4_,
                                                      CONCAT48(auVar7._8_4_ + auVar7._8_4_,
                                                               CONCAT44(auVar7._4_4_ + auVar7._4_4_,
                                                                        auVar7._0_4_ + auVar7._0_4_)
                                                              ))));
      auVar11 = vblendvps_avx(ZEXT1632(auVar7),auVar11,auVar17);
      auVar18._0_4_ = (float)(auVar12._0_4_ ^ auVar11._0_4_);
      auVar18._4_4_ = (float)(auVar12._4_4_ ^ auVar11._4_4_);
      auVar18._8_4_ = (float)(auVar12._8_4_ ^ auVar11._8_4_);
      auVar18._12_4_ = (float)(auVar12._12_4_ ^ auVar11._12_4_);
      auVar18._16_4_ = (float)(auVar12._16_4_ ^ auVar11._16_4_);
      auVar18._20_4_ = (float)(auVar12._20_4_ ^ auVar11._20_4_);
      auVar18._24_4_ = (float)(auVar12._24_4_ ^ auVar11._24_4_);
      auVar18._28_4_ = (float)(auVar12._28_4_ ^ auVar11._28_4_);
      auVar19._0_4_ = auVar18._0_4_ + auVar18._0_4_;
      auVar19._4_4_ = auVar18._4_4_ + auVar18._4_4_;
      auVar19._8_4_ = auVar18._8_4_ + auVar18._8_4_;
      auVar19._12_4_ = auVar18._12_4_ + auVar18._12_4_;
      auVar19._16_4_ = auVar18._16_4_ + auVar18._16_4_;
      auVar19._20_4_ = auVar18._20_4_ + auVar18._20_4_;
      auVar19._24_4_ = auVar18._24_4_ + auVar18._24_4_;
      auVar19._28_4_ = auVar18._28_4_ + auVar18._28_4_;
      auVar11 = vblendvps_avx(auVar18,auVar19,auVar5);
      auVar20._8_4_ = 0x40490fdb;
      auVar20._0_8_ = 0x40490fdb40490fdb;
      auVar20._12_4_ = 0x40490fdb;
      auVar20._16_4_ = 0x40490fdb;
      auVar20._20_4_ = 0x40490fdb;
      auVar20._24_4_ = 0x40490fdb;
      auVar20._28_4_ = 0x40490fdb;
      auVar12 = vcmpps_avx(auVar10,auVar14,1);
      auVar15 = vsubps_avx(auVar20,auVar11);
      auVar11 = vblendvps_avx(auVar11,auVar15,auVar12);
      auVar12 = vsubps_avx(auVar24,auVar11);
      auVar11 = vblendvps_avx(auVar12,auVar11,auVar5);
      fVar3 = *(float *)((long)&this[0x11].super_PolarExtentCore._vptr_PolarExtentCore + 4);
      auVar12._0_4_ = auVar11._0_4_ * fVar2 + fVar3;
      auVar12._4_4_ = auVar11._4_4_ * fVar2 + fVar3;
      auVar12._8_4_ = auVar11._8_4_ * fVar2 + fVar3;
      auVar12._12_4_ = auVar11._12_4_ * fVar2 + fVar3;
      auVar12._16_4_ = auVar11._16_4_ * fVar2 + fVar3;
      auVar12._20_4_ = auVar11._20_4_ * fVar2 + fVar3;
      auVar12._24_4_ = auVar11._24_4_ * fVar2 + fVar3;
      auVar12._28_4_ = auVar11._28_4_ + fVar3;
      auVar11 = vcmpps_avx(auVar10,auVar13,6);
      auVar11 = vandps_avx(auVar11,auVar12);
      vblendvps_avx(auVar11,auVar16,auVar4);
    }
  }
  return in_RAX;
}

Assistant:

inline batch<float, A> broadcast(float val, requires_arch<avx>) noexcept
        {
            return _mm256_set1_ps(val);
        }